

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall wasm::ReFinalize::~ReFinalize(ReFinalize *this)

{
  ReFinalize *this_local;
  
  ~ReFinalize(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }